

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::Error(Parser *this,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *msg_local;
  Parser *this_local;
  
  msg_local = msg;
  this_local = this;
  std::operator+(&local_40,"error: ",in_RDX);
  Message((Parser *)msg,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  CheckedError::CheckedError((CheckedError *)this,true);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::Error(const std::string &msg) {
  Message("error: " + msg);
  return CheckedError(true);
}